

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::PowModBarrett(BN *__return_storage_ptr__,BN *this,BN *power,BN *mod)

{
  bool bVar1;
  size_t sVar2;
  BN local_f0;
  BN local_d8;
  BN local_c0;
  BN local_a8;
  int local_8c;
  const_iterator cStack_88;
  int i;
  ushort *local_80;
  bt *curr;
  int local_70;
  bt mask;
  int len;
  undefined1 local_60 [8];
  BN t;
  undefined1 local_40 [8];
  BN mu;
  BN *mod_local;
  BN *power_local;
  BN *this_local;
  BN *res;
  
  mu.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)mod;
  bVar1 = is0(power);
  if (bVar1) {
    bn1();
  }
  else {
    anon_unknown.dwarf_102a0::reductionBarrettPrecomputation
              ((BN *)local_40,
               (BN *)mu.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    t.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    bn1();
    operator%((BN *)local_60,this,
              (BN *)mu.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar2 = bitCount(power);
    local_70 = (int)sVar2;
    curr._6_2_ = 1;
    cStack_88 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&power->ba);
    local_80 = __gnu_cxx::
               __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&stack0xffffffffffffff78);
    for (local_8c = 0; local_8c < local_70; local_8c = local_8c + 1) {
      if (curr._6_2_ == 0) {
        curr._6_2_ = 1;
        local_80 = local_80 + 1;
      }
      if ((*local_80 & curr._6_2_) != 0) {
        operator*(&local_c0,__return_storage_ptr__,(BN *)local_60);
        reductionBarrett(&local_a8,&local_c0,
                         (BN *)mu.ba.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(BN *)local_40);
        operator=(__return_storage_ptr__,&local_a8);
        ~BN(&local_a8);
        ~BN(&local_c0);
      }
      if (local_8c + 1 != local_70) {
        Qrt(&local_f0,(BN *)local_60);
        reductionBarrett(&local_d8,&local_f0,
                         (BN *)mu.ba.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(BN *)local_40);
        operator=((BN *)local_60,&local_d8);
        ~BN(&local_d8);
        ~BN(&local_f0);
      }
      curr._6_2_ = curr._6_2_ << 1;
    }
    t.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    ~BN((BN *)local_60);
    if ((t.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      ~BN(__return_storage_ptr__);
    }
    ~BN((BN *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::PowModBarrett(const BN& power, const BN& mod) const {
    if(power.is0())
        return BN::bn1();

    BN mu = reductionBarrettPrecomputation(mod);
    BN res(BN::bn1());
    BN t = (*this) % mod;

    int len = power.bitCount();
    bt mask = 1;
    const bt *curr = &*power.ba.begin();
    for(int i = 0; i < len; i++) {
        if(!mask) {
            mask = 1;
            ++curr;
        }
        if( (*curr) & mask)
            res = (res*t).reductionBarrett(mod, mu);

        if (i + 1 != len)
            t = t.Qrt().reductionBarrett(mod, mu);
        mask <<= 1;
    }
    return res;
}